

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

SectionTracker *
Catch::TestCaseTracking::SectionTracker::acquire
          (TrackerContext *ctx,NameAndLocationRef *nameAndLocation)

{
  bool bVar1;
  TrackerContext *in_RDI;
  unique_ptr<Catch::TestCaseTracking::SectionTracker> newTracker;
  ITracker *childTracker;
  ITracker *currentTracker;
  SectionTracker *tracker;
  ITracker *child;
  SectionTracker *in_stack_ffffffffffffff50;
  string *_name;
  NameAndLocation *in_stack_ffffffffffffff60;
  TrackerContext *in_stack_ffffffffffffff70;
  NameAndLocation *in_stack_ffffffffffffff78;
  ITracker *in_stack_ffffffffffffff80;
  StringRef *in_stack_ffffffffffffff88;
  unique_ptr<Catch::TestCaseTracking::SectionTracker> local_30;
  SectionTracker *local_28;
  ITracker *local_20;
  SectionTracker *local_18;
  TrackerContext *local_8;
  
  local_8 = in_RDI;
  local_20 = TrackerContext::currentTracker(in_RDI);
  local_28 = (SectionTracker *)
             ITracker::findChild(in_stack_ffffffffffffff80,
                                 (NameAndLocationRef *)in_stack_ffffffffffffff78);
  local_18 = local_28;
  if (local_28 == (SectionTracker *)0x0) {
    _name = (string *)&stack0xffffffffffffff80;
    StringRef::operator_cast_to_string(in_stack_ffffffffffffff88);
    NameAndLocation::NameAndLocation
              (in_stack_ffffffffffffff60,_name,(SourceLineInfo *)in_stack_ffffffffffffff50);
    Detail::
    make_unique<Catch::TestCaseTracking::SectionTracker,Catch::TestCaseTracking::NameAndLocation,Catch::TestCaseTracking::TrackerContext&,Catch::TestCaseTracking::ITracker*>
              (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,(ITracker **)local_20);
    NameAndLocation::~NameAndLocation((NameAndLocation *)0x18f5e5);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
    in_stack_ffffffffffffff50 =
         Detail::unique_ptr<Catch::TestCaseTracking::SectionTracker>::get(&local_30);
    child = local_20;
    local_18 = in_stack_ffffffffffffff50;
    Detail::unique_ptr<Catch::TestCaseTracking::ITracker>::
    unique_ptr<Catch::TestCaseTracking::SectionTracker,void>
              ((unique_ptr<Catch::TestCaseTracking::ITracker> *)in_stack_ffffffffffffff50,
               (unique_ptr<Catch::TestCaseTracking::SectionTracker> *)local_20);
    ITracker::addChild((ITracker *)in_stack_ffffffffffffff50,(ITrackerPtr *)child);
    Detail::unique_ptr<Catch::TestCaseTracking::ITracker>::~unique_ptr
              ((unique_ptr<Catch::TestCaseTracking::ITracker> *)in_stack_ffffffffffffff50);
    Detail::unique_ptr<Catch::TestCaseTracking::SectionTracker>::~unique_ptr
              ((unique_ptr<Catch::TestCaseTracking::SectionTracker> *)in_stack_ffffffffffffff50);
  }
  bVar1 = TrackerContext::completedCycle(local_8);
  if (!bVar1) {
    tryOpen(in_stack_ffffffffffffff50);
  }
  return local_18;
}

Assistant:

SectionTracker& SectionTracker::acquire( TrackerContext& ctx, NameAndLocationRef const& nameAndLocation ) {
        SectionTracker* tracker;

        ITracker& currentTracker = ctx.currentTracker();
        if ( ITracker* childTracker =
                 currentTracker.findChild( nameAndLocation ) ) {
            assert( childTracker );
            assert( childTracker->isSectionTracker() );
            tracker = static_cast<SectionTracker*>( childTracker );
        } else {
            auto newTracker = Catch::Detail::make_unique<SectionTracker>(
                NameAndLocation{ static_cast<std::string>(nameAndLocation.name),
                                 nameAndLocation.location },
                ctx,
                &currentTracker );
            tracker = newTracker.get();
            currentTracker.addChild( CATCH_MOVE( newTracker ) );
        }

        if ( !ctx.completedCycle() ) {
            tracker->tryOpen();
        }

        return *tracker;
    }